

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

inform_dist * inform_dist_dup(inform_dist *dist)

{
  inform_dist *dest;
  
  if ((dist != (inform_dist *)0x0) &&
     (dest = inform_dist_alloc(dist->size), dest != (inform_dist *)0x0)) {
    inform_dist_copy(dist,dest);
    return dest;
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_dup(inform_dist const *dist)
{
    // if the source distribution is NULL, then just return NULL.
    if (dist == NULL)
    {
        return NULL;
    }
    // allocate the new distribution
    inform_dist *dup = inform_dist_alloc(dist->size);
    // if the allocation succeeded
    if (dup != NULL)
    {
        // copy the source distribution to the new distribution
        inform_dist_copy(dist, dup);
    }
    // return the (potentially NULL) distribution
    return dup;
}